

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

string * __thiscall
cmState::ModeToString_abi_cxx11_(string *__return_storage_ptr__,cmState *this,Mode mode)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  default:
    pcVar2 = "UNKNOWN";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "PROJECT";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "SCRIPT";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "FIND_PACKAGE";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "CTEST";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "CPACK";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmState::ModeToString(cmState::Mode mode)
{
  switch (mode) {
    case Project:
      return "PROJECT";
    case Script:
      return "SCRIPT";
    case FindPackage:
      return "FIND_PACKAGE";
    case CTest:
      return "CTEST";
    case CPack:
      return "CPACK";
    case Unknown:
      return "UNKNOWN";
  }
  return "UNKNOWN";
}